

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::BasicAuthIntegrationTest_shouldRejectRequestWithWrongUsername_Test::
TestBody(BasicAuthIntegrationTest_shouldRejectRequestWithWrongUsername_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_98;
  Message local_90 [3];
  int local_74;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  Response metrics;
  BasicAuthIntegrationTest_shouldRejectRequestWithWrongUsername_Test *this_local;
  
  metrics.contentType.field_2._8_8_ = this;
  std::function<void(void*)>::operator=
            ((function<void(void*)> *)
             &(this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_,
             (anon_class_8_1_8991fb9c *)((long)&metrics.contentType.field_2 + 8));
  IntegrationTest::FetchMetrics
            ((Response *)&gtest_ar.message_,(IntegrationTest *)this,
             &(this->super_BasicAuthIntegrationTest).super_IntegrationTest.default_metrics_path_);
  local_74 = 0x191;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_70,"metrics.code","401",(long *)&gtest_ar.message_,&local_74);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(local_90);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc"
               ,0xfb,message);
    testing::internal::AssertHelper::operator=(&local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  IntegrationTest::Response::~Response((Response *)&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(BasicAuthIntegrationTest, shouldRejectRequestWithWrongUsername) {
  fetchPrePerform_ = [&](CURL* curl) {
    curl_easy_setopt(curl, CURLOPT_HTTPAUTH, CURLAUTH_BASIC);
    curl_easy_setopt(curl, CURLOPT_USERNAME, "dummy");
    curl_easy_setopt(curl, CURLOPT_PASSWORD, password_.c_str());
  };

  const auto metrics = FetchMetrics(default_metrics_path_);
  ASSERT_EQ(metrics.code, 401);
}